

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IceContainer.cpp
# Opt level: O2

Container * __thiscall
IceCore::Container::FindPrev(Container *this,udword *entry,FindMode find_mode)

{
  bool bVar1;
  uint uVar2;
  udword Location;
  udword local_1c;
  
  bVar1 = Contains(this,*entry,&local_1c);
  if (bVar1) {
    uVar2 = local_1c - 1;
    if (local_1c == 0) {
      uVar2 = 0;
      if (find_mode == FIND_WRAP) {
        uVar2 = this->mCurNbEntries - 1;
      }
    }
    *entry = this->mEntries[uVar2];
  }
  return this;
}

Assistant:

Container& Container::FindPrev(udword& entry, FindMode find_mode)
{
	udword Location;
	if(Contains(entry, &Location))
	{
		Location--;
		if(Location==0xffffffff)	Location = find_mode==FIND_WRAP ? mCurNbEntries-1 : 0;
		entry = mEntries[Location];
	}
	return *this;
}